

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generator.cc
# Opt level: O0

StatusOr<google::protobuf::FeatureSetDefaults> * __thiscall
google::protobuf::compiler::CodeGenerator::BuildFeatureSetDefaults
          (StatusOr<google::protobuf::FeatureSetDefaults> *__return_storage_ptr__,
          CodeGenerator *this)

{
  Edition EVar1;
  Edition minimum_edition;
  Descriptor *this_00;
  Span<const_google::protobuf::FieldDescriptor_*const> extensions;
  Edition in_stack_ffffffffffffff78;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_40;
  Descriptor *local_28;
  undefined8 local_20;
  CodeGenerator *local_18;
  CodeGenerator *this_local;
  
  local_18 = this;
  this_local = (CodeGenerator *)__return_storage_ptr__;
  this_00 = FeatureSet::descriptor();
  (*this->_vptr_CodeGenerator[6])();
  absl::lts_20250127::Span<google::protobuf::FieldDescriptor_const*const>::
  Span<std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>,void,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>,int>
            ((Span<google::protobuf::FieldDescriptor_const*const> *)&local_28,&local_40);
  EVar1 = ProtocMinimumEdition();
  minimum_edition = MaximumKnownEdition();
  extensions.len_._0_4_ = EVar1;
  extensions.ptr_ = (pointer)local_20;
  extensions.len_._4_4_ = 0;
  FeatureResolver::CompileDefaults
            (__return_storage_ptr__,(FeatureResolver *)this_00,local_28,extensions,minimum_edition,
             in_stack_ffffffffffffff78);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~vector(&local_40);
  return __return_storage_ptr__;
}

Assistant:

absl::StatusOr<FeatureSetDefaults> CodeGenerator::BuildFeatureSetDefaults()
    const {
  // For generators that don't fully support editions yet, provide an
  // optimistic set of defaults.  Protoc will check this condition later
  // anyway.
  return FeatureResolver::CompileDefaults(
      FeatureSet::descriptor(), GetFeatureExtensions(), ProtocMinimumEdition(),
      MaximumKnownEdition());
}